

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O2

void test_bson_iter_overwrite_int64(void)

{
  char cVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  bson_iter_t iter;
  bson_t b;
  undefined1 auStack_200 [128];
  undefined1 local_180 [368];
  
  bson_init(local_180);
  cVar1 = bson_append_int64(local_180,"key",0xffffffffffffffff,0x4d2);
  if (cVar1 == '\0') {
    pcVar5 = "bson_append_int64 (&b, \"key\", -1, 1234)";
    uVar4 = 0x19f;
  }
  else {
    cVar1 = bson_iter_init_find(auStack_200,local_180,"key");
    if (cVar1 == '\0') {
      pcVar5 = "bson_iter_init_find (&iter, &b, \"key\")";
      uVar4 = 0x1a0;
    }
    else {
      iVar2 = bson_iter_type(auStack_200);
      if (iVar2 == 0x12) {
        bson_iter_overwrite_int64(auStack_200,0x1221);
        cVar1 = bson_iter_init_find(auStack_200,local_180,"key");
        if (cVar1 == '\0') {
          pcVar5 = "bson_iter_init_find (&iter, &b, \"key\")";
          uVar4 = 0x1a3;
        }
        else {
          iVar2 = bson_iter_type(auStack_200);
          if (iVar2 == 0x12) {
            lVar3 = bson_iter_int64(auStack_200);
            if (lVar3 == 0x1221) {
              bson_destroy(local_180);
              return;
            }
            fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d)bson_iter_int64 (&iter) == 4641\n",
                    0x1a5);
            abort();
          }
          pcVar5 = "BSON_ITER_HOLDS_INT64 (&iter)";
          uVar4 = 0x1a4;
        }
      }
      else {
        pcVar5 = "BSON_ITER_HOLDS_INT64 (&iter)";
        uVar4 = 0x1a1;
      }
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
          uVar4,"test_bson_iter_overwrite_int64",pcVar5);
  abort();
}

Assistant:

static void
test_bson_iter_overwrite_int64 (void)
{
   bson_iter_t iter;
   bson_t b;

   bson_init (&b);
   BSON_ASSERT (bson_append_int64 (&b, "key", -1, 1234));
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_INT64 (&iter));
   bson_iter_overwrite_int64 (&iter, 4641);
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_INT64 (&iter));
   BSON_ASSERT_CMPINT (bson_iter_int64 (&iter), ==, 4641);
   bson_destroy (&b);
}